

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O1

EntityExpRes __thiscall
xercesc_4_0::DGXMLScanner::scanEntityRef
          (DGXMLScanner *this,bool inAttVal,XMLCh *firstCh,XMLCh *secondCh,bool *escaped)

{
  ReaderMgr *this_00;
  XMLBufferMgr *this_01;
  XMLSize_t XVar1;
  DTDGrammar *this_02;
  XMLDocumentHandler *pXVar2;
  XMLValidator *this_03;
  bool bVar3;
  bool bVar4;
  XMLCh XVar5;
  int iVar6;
  XMLBuffer *toFill;
  DTDEntityDecl *entity;
  XMLReader *pXVar7;
  ulong uVar8;
  RuntimeException *this_04;
  XMLCh *pXVar9;
  EntityExpRes EVar10;
  Codes toEmit;
  XMLBufBid bbName;
  InputSource *srcUsed;
  int colonPosition;
  XMLCh expLimStr [32];
  undefined4 extraout_var;
  
  *secondCh = L'\0';
  *escaped = false;
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  XVar1 = ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum;
  bVar3 = ReaderMgr::skippedChar(this_00,L'#');
  if (bVar3) {
    bVar3 = XMLScanner::scanCharRef(&this->super_XMLScanner,firstCh,secondCh);
    if (!bVar3) {
      return EntityExp_Failed;
    }
    *escaped = true;
    if (XVar1 == ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum) {
      return EntityExp_Returned;
    }
    XMLScanner::emitError(&this->super_XMLScanner,PartialMarkupInEntity);
    return EntityExp_Returned;
  }
  this_01 = &(this->super_XMLScanner).fBufMgr;
  toFill = XMLBufferMgr::bidOnBuffer(this_01);
  bVar3 = (this->super_XMLScanner).fDoNamespaces;
  toFill->fIndex = 0;
  pXVar7 = (this->super_XMLScanner).fReaderMgr.fCurReader;
  if (bVar3 == true) {
    bVar3 = XMLReader::getQName(pXVar7,toFill,&colonPosition);
  }
  else {
    bVar3 = XMLReader::getName(pXVar7,toFill,false);
  }
  if (bVar3 == false) {
    if (toFill->fIndex == 0) {
      EVar10 = EntityExp_Failed;
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedEntityRefName);
    }
    else {
      pXVar9 = toFill->fBuffer;
      pXVar9[toFill->fIndex] = L'\0';
      EVar10 = EntityExp_Failed;
      XMLScanner::emitError
                (&this->super_XMLScanner,InvalidEntityRefName,pXVar9,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    goto LAB_002a2625;
  }
  bVar3 = ReaderMgr::skippedChar(this_00,L';');
  if (!bVar3) {
    pXVar9 = toFill->fBuffer;
    pXVar9[toFill->fIndex] = L'\0';
    XMLScanner::emitError
              (&this->super_XMLScanner,UnterminatedEntityRef,pXVar9,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0);
  }
  if (XVar1 != ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum) {
    XMLScanner::emitError(&this->super_XMLScanner,PartialMarkupInEntity);
  }
  this_02 = this->fDTDGrammar;
  pXVar9 = toFill->fBuffer;
  pXVar9[toFill->fIndex] = L'\0';
  entity = DTDGrammar::getEntityDecl(this_02,pXVar9);
  bVar3 = (this->super_XMLScanner).fStandalone;
  if (entity == (DTDEntityDecl *)0x0) {
    toEmit = EntityNotFound;
    if ((bVar3 == false) && ((this->super_XMLScanner).fHasNoDTD == false)) {
      EVar10 = EntityExp_Failed;
      if ((this->super_XMLScanner).fValidate == true) {
        this_03 = (this->super_XMLScanner).fValidator;
        pXVar9 = toFill->fBuffer;
        pXVar9[toFill->fIndex] = L'\0';
        XMLValidator::emitError
                  (this_03,VC_EntityNotFound,pXVar9,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      goto LAB_002a2625;
    }
LAB_002a2466:
    pXVar9 = toFill->fBuffer;
    pXVar9[toFill->fIndex] = L'\0';
    EVar10 = EntityExp_Failed;
    XMLScanner::emitError
              (&this->super_XMLScanner,toEmit,pXVar9,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
  }
  else {
    if ((bVar3 != false) &&
       (iVar6 = (*(entity->super_XMLEntityDecl).super_XSerializable._vptr_XSerializable[5])(entity),
       (char)iVar6 == '\0')) {
      pXVar9 = toFill->fBuffer;
      pXVar9[toFill->fIndex] = L'\0';
      XMLScanner::emitError
                (&this->super_XMLScanner,IllegalRefInStandalone,pXVar9,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    if ((entity->super_XMLEntityDecl).fIsExternal == true) {
      toEmit = NoUnparsedEntityRefs;
      if ((entity->super_XMLEntityDecl).fNotationName != (XMLCh *)0x0) goto LAB_002a2466;
      if (inAttVal) {
        XMLScanner::emitError(&this->super_XMLScanner,NoExtRefsInAttValue);
      }
      pXVar7 = ReaderMgr::createReader
                         (this_00,(entity->super_XMLEntityDecl).fBaseURI,
                          (entity->super_XMLEntityDecl).fSystemId,
                          (entity->super_XMLEntityDecl).fPublicId,false,RefFrom_NonLiteral,
                          Type_General,Source_External,&srcUsed,
                          (this->super_XMLScanner).fCalculateSrcOfs,
                          (this->super_XMLScanner).fLowWaterMark,
                          (this->super_XMLScanner).fDisableDefaultEntityResolution);
      if (pXVar7 == (XMLReader *)0x0) {
        this_04 = (RuntimeException *)__cxa_allocate_exception(0x30);
        if (srcUsed == (InputSource *)0x0) {
          pXVar9 = (entity->super_XMLEntityDecl).fSystemId;
        }
        else {
          iVar6 = (*srcUsed->_vptr_InputSource[5])();
          pXVar9 = (XMLCh *)CONCAT44(extraout_var,iVar6);
        }
        RuntimeException::RuntimeException
                  (this_04,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                   ,0xd96,Gen_CouldNotOpenExtEntity,pXVar9,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                   (this->super_XMLScanner).fMemoryManager);
        __cxa_throw(this_04,&RuntimeException::typeinfo,XMLException::~XMLException);
      }
      bVar3 = ReaderMgr::pushReader(this_00,pXVar7,&entity->super_XMLEntityDecl);
      if (bVar3) {
        if ((this->super_XMLScanner).fSecurityManager != (SecurityManager *)0x0) {
          XVar1 = (this->super_XMLScanner).fEntityExpansionLimit;
          uVar8 = (this->super_XMLScanner).fEntityExpansionCount + 1;
          (this->super_XMLScanner).fEntityExpansionCount = uVar8;
          if (XVar1 < uVar8) {
            XMLString::sizeToText(XVar1,expLimStr,0x1f,10,(this->super_XMLScanner).fMemoryManager);
            XMLScanner::emitError
                      (&this->super_XMLScanner,EntityExpansionLimitExceeded,expLimStr,(XMLCh *)0x0,
                       (XMLCh *)0x0,(XMLCh *)0x0);
            (this->super_XMLScanner).fEntityExpansionCount = 0;
          }
        }
        pXVar2 = (this->super_XMLScanner).fDocHandler;
        if (pXVar2 != (XMLDocumentHandler *)0x0 && !inAttVal) {
          (*pXVar2->_vptr_XMLDocumentHandler[0xc])(pXVar2,entity);
        }
        bVar4 = XMLScanner::checkXMLDecl(&this->super_XMLScanner,true);
        if (bVar4) {
          XMLScanner::scanXMLDecl(&this->super_XMLScanner,Decl_Text);
        }
      }
      else {
        XMLScanner::emitError
                  (&this->super_XMLScanner,RecursiveEntity,(entity->super_XMLEntityDecl).fName,
                   (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      if (srcUsed != (InputSource *)0x0) {
        (*srcUsed->_vptr_InputSource[1])(srcUsed);
      }
      EVar10 = EntityExp_Failed;
      if (!bVar3) goto LAB_002a2625;
    }
    else {
      iVar6 = (*(entity->super_XMLEntityDecl).super_XSerializable._vptr_XSerializable[7])(entity);
      if ((char)iVar6 != '\0') {
        *firstCh = *(entity->super_XMLEntityDecl).fValue;
        *escaped = true;
        EVar10 = EntityExp_Returned;
        goto LAB_002a2625;
      }
      pXVar7 = ReaderMgr::createIntEntReader
                         (this_00,(entity->super_XMLEntityDecl).fName,RefFrom_NonLiteral,
                          Type_General,(entity->super_XMLEntityDecl).fValue,
                          (entity->super_XMLEntityDecl).fValueLen,false,true,100);
      bVar3 = ReaderMgr::pushReader(this_00,pXVar7,&entity->super_XMLEntityDecl);
      if (!bVar3) {
        XMLScanner::emitError
                  (&this->super_XMLScanner,RecursiveEntity,(entity->super_XMLEntityDecl).fName,
                   (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      if ((this->super_XMLScanner).fSecurityManager != (SecurityManager *)0x0) {
        XVar1 = (this->super_XMLScanner).fEntityExpansionLimit;
        uVar8 = (this->super_XMLScanner).fEntityExpansionCount + 1;
        (this->super_XMLScanner).fEntityExpansionCount = uVar8;
        if (XVar1 < uVar8) {
          XMLString::sizeToText(XVar1,expLimStr,0x1f,10,(this->super_XMLScanner).fMemoryManager);
          XMLScanner::emitError
                    (&this->super_XMLScanner,EntityExpansionLimitExceeded,expLimStr,(XMLCh *)0x0,
                     (XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
      pXVar2 = (this->super_XMLScanner).fDocHandler;
      if (pXVar2 != (XMLDocumentHandler *)0x0 && !inAttVal) {
        (*pXVar2->_vptr_XMLDocumentHandler[0xc])(pXVar2,entity);
      }
      bVar3 = XMLScanner::checkXMLDecl(&this->super_XMLScanner,true);
      if (bVar3) {
        XMLScanner::emitError(&this->super_XMLScanner,TextDeclNotLegalHere);
        do {
          XVar5 = ReaderMgr::getNextChar(this_00);
          if (XVar5 == L'>') break;
        } while (XVar5 != L'\0');
      }
    }
    EVar10 = EntityExp_Pushed;
  }
LAB_002a2625:
  XMLBufferMgr::releaseBuffer(this_01,toFill);
  return EVar10;
}

Assistant:

DGXMLScanner::EntityExpRes
DGXMLScanner::scanEntityRef(  const   bool    inAttVal
                            ,       XMLCh&  firstCh
                            ,       XMLCh&  secondCh
                            ,       bool&   escaped)
{
    // Assume no escape
    secondCh = 0;
    escaped = false;

    // We have to insure that its all in one entity
    const XMLSize_t curReader = fReaderMgr.getCurrentReaderNum();

    //  If the next char is a pound, then its a character reference and we
    //  need to expand it always.
    if (fReaderMgr.skippedChar(chPound))
    {
        //  Its a character reference, so scan it and get back the numeric
        //  value it represents.
        if (!scanCharRef(firstCh, secondCh))
            return EntityExp_Failed;

        escaped = true;

        if (curReader != fReaderMgr.getCurrentReaderNum())
            emitError(XMLErrs::PartialMarkupInEntity);

        return EntityExp_Returned;
    }

    // Expand it since its a normal entity ref
    XMLBufBid bbName(&fBufMgr);

    int  colonPosition;
    bool validName = fDoNamespaces ? fReaderMgr.getQName(bbName.getBuffer(), &colonPosition) :
                                     fReaderMgr.getName(bbName.getBuffer());
    if (!validName)
    {
        if (bbName.isEmpty())
            emitError(XMLErrs::ExpectedEntityRefName);
        else
            emitError(XMLErrs::InvalidEntityRefName, bbName.getRawBuffer());
        return EntityExp_Failed;
    }

    //  Next char must be a semi-colon. But if its not, just emit
    //  an error and try to continue.
    if (!fReaderMgr.skippedChar(chSemiColon))
        emitError(XMLErrs::UnterminatedEntityRef, bbName.getRawBuffer());

    // Make sure we ended up on the same entity reader as the & char
    if (curReader != fReaderMgr.getCurrentReaderNum())
        emitError(XMLErrs::PartialMarkupInEntity);

    // Look up the name in the general entity pool
    XMLEntityDecl* decl = fDTDGrammar->getEntityDecl(bbName.getRawBuffer());

    // If it does not exist, then obviously an error
    if (!decl)
    {
        // XML 1.0 Section 4.1
        // Well-formedness Constraint for entity not found:
        //   In a document without any DTD, a document with only an internal DTD subset which contains no parameter entity references,
        //      or a document with "standalone='yes'", for an entity reference that does not occur within the external subset
        //      or a parameter entity
        //
        // Else it's Validity Constraint
        if (fStandalone || fHasNoDTD)
            emitError(XMLErrs::EntityNotFound, bbName.getRawBuffer());
        else {
            if (fValidate)
                fValidator->emitError(XMLValid::VC_EntityNotFound, bbName.getRawBuffer());
        }

        return EntityExp_Failed;
    }

    // XML 1.0 Section 4.1
    //  If we are a standalone document, then it has to have been declared
    //  in the internal subset.
    if (fStandalone && !decl->getDeclaredInIntSubset())
        emitError(XMLErrs::IllegalRefInStandalone, bbName.getRawBuffer());

    if (decl->isExternal())
    {
        // If its unparsed, then its not valid here
        if (decl->isUnparsed())
        {
            emitError(XMLErrs::NoUnparsedEntityRefs, bbName.getRawBuffer());
            return EntityExp_Failed;
        }

        // If we are in an attribute value, then not valid but keep going
        if (inAttVal)
            emitError(XMLErrs::NoExtRefsInAttValue);

        // And now create a reader to read this entity
        InputSource* srcUsed;
        XMLReader* reader = fReaderMgr.createReader
        (
            decl->getBaseURI()
            , decl->getSystemId()
            , decl->getPublicId()
            , false
            , XMLReader::RefFrom_NonLiteral
            , XMLReader::Type_General
            , XMLReader::Source_External
            , srcUsed
            , fCalculateSrcOfs
            , fLowWaterMark
            , fDisableDefaultEntityResolution
        );

        // Put a janitor on the source so it gets cleaned up on exit
        Janitor<InputSource> janSrc(srcUsed);

        //  If the creation failed, and its not because the source was empty,
        //  then emit an error and return.
        if (!reader)
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Gen_CouldNotOpenExtEntity, srcUsed ? srcUsed->getSystemId() : decl->getSystemId(), fMemoryManager);

        //  Push the reader. If its a recursive expansion, then emit an error
        //  and return an failure.
        if (!fReaderMgr.pushReader(reader, decl))
        {
            emitError(XMLErrs::RecursiveEntity, decl->getName());
            return EntityExp_Failed;
        }

        // here's where we need to check if there's a SecurityManager,
        // how many entity references we've had
        if(fSecurityManager != 0 && ++fEntityExpansionCount > fEntityExpansionLimit) {
            XMLCh expLimStr[32];
            XMLString::sizeToText(fEntityExpansionLimit, expLimStr, 31, 10, fMemoryManager);
            emitError
            (
                XMLErrs::EntityExpansionLimitExceeded
                , expLimStr
            );
            // there seems nothing better to do than reset the entity expansion counter
            fEntityExpansionCount = 0;
        }

        //  Do a start entity reference event.
        //
        //  <TBD> For now, we supress them in att values. Later, when
        //  the stuff is in place to correctly allow DOM to handle them
        //  we'll turn this back on.
        if (fDocHandler && !inAttVal)
            fDocHandler->startEntityReference(*decl);

        // If it starts with the XML string, then parse a text decl
        if (checkXMLDecl(true))
            scanXMLDecl(Decl_Text);
    }
    else
    {
        //  If its one of the special char references, then we can return
        //  it as a character, and its considered escaped.
        if (decl->getIsSpecialChar())
        {
            firstCh = decl->getValue()[0];
            escaped = true;
            return EntityExp_Returned;
        }

        //  Create a reader over a memory stream over the entity value
        //  We force it to assume UTF-16 by passing in an encoding
        //  string. This way it won't both trying to predecode the
        //  first line, looking for an XML/TextDecl.
        XMLReader* valueReader = fReaderMgr.createIntEntReader
        (
            decl->getName()
            , XMLReader::RefFrom_NonLiteral
            , XMLReader::Type_General
            , decl->getValue()
            , decl->getValueLen()
            , false
        );

        //  Try to push the entity reader onto the reader manager stack,
        //  where it will become the subsequent input. If it fails, that
        //  means the entity is recursive, so issue an error. The reader
        //  will have just been discarded, but we just keep going.
        if (!fReaderMgr.pushReader(valueReader, decl))
            emitError(XMLErrs::RecursiveEntity, decl->getName());

        // here's where we need to check if there's a SecurityManager,
        // how many entity references we've had
        if(fSecurityManager != 0 && ++fEntityExpansionCount > fEntityExpansionLimit) {
            XMLCh expLimStr[32];
            XMLString::sizeToText(fEntityExpansionLimit, expLimStr, 31, 10, fMemoryManager);
            emitError
            (
                XMLErrs::EntityExpansionLimitExceeded
                , expLimStr
            );
        }

        //  Do a start entity reference event.
        //
        //  <TBD> For now, we supress them in att values. Later, when
        //  the stuff is in place to correctly allow DOM to handle them
        //  we'll turn this back on.
        if (fDocHandler && !inAttVal)
            fDocHandler->startEntityReference(*decl);

        // If it starts with the XML string, then it's an error
        if (checkXMLDecl(true)) {
            emitError(XMLErrs::TextDeclNotLegalHere);
            fReaderMgr.skipPastChar(chCloseAngle);
        }
    }
    return EntityExp_Pushed;
}